

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::Int64Vector::_internal_add_vector(Int64Vector *this,int64_t value)

{
  int64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<long>::Add(&this->vector_,&local_8);
  return;
}

Assistant:

inline void Int64Vector::_internal_add_vector(int64_t value) {
  vector_.Add(value);
}